

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

FileMetaData *
leveldb::FindSmallestBoundaryFile
          (InternalKeyComparator *icmp,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *level_files,
          InternalKey *largest_key)

{
  InternalKey *a;
  Comparator *pCVar1;
  pointer ppFVar2;
  FileMetaData *pFVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  FileMetaData *local_60;
  Slice local_50;
  Slice local_40;
  
  pCVar1 = icmp->user_comparator_;
  uVar5 = 0;
  local_60 = (FileMetaData *)0x0;
  do {
    ppFVar2 = (level_files->
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(level_files->
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3) <= uVar5) {
      return local_60;
    }
    pFVar3 = ppFVar2[uVar5];
    a = &pFVar3->smallest;
    iVar4 = InternalKeyComparator::Compare(icmp,a,largest_key);
    if (0 < iVar4) {
      local_40 = InternalKey::user_key(a);
      local_50 = InternalKey::user_key(largest_key);
      iVar4 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_40,&local_50);
      if (iVar4 == 0) {
        if (local_60 != (FileMetaData *)0x0) {
          iVar4 = InternalKeyComparator::Compare(icmp,a,&local_60->smallest);
          if (-1 < iVar4) goto LAB_00117b27;
        }
        local_60 = pFVar3;
      }
    }
LAB_00117b27:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

FileMetaData* FindSmallestBoundaryFile(
    const InternalKeyComparator& icmp,
    const std::vector<FileMetaData*>& level_files,
    const InternalKey& largest_key) {
  const Comparator* user_cmp = icmp.user_comparator();
  FileMetaData* smallest_boundary_file = nullptr;
  for (size_t i = 0; i < level_files.size(); ++i) {
    FileMetaData* f = level_files[i];
    if (icmp.Compare(f->smallest, largest_key) > 0 &&
        user_cmp->Compare(f->smallest.user_key(), largest_key.user_key()) ==
            0) {
      if (smallest_boundary_file == nullptr ||
          icmp.Compare(f->smallest, smallest_boundary_file->smallest) < 0) {
        smallest_boundary_file = f;
      }
    }
  }
  return smallest_boundary_file;
}